

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.c
# Opt level: O3

deCommandLine * deCommandLine_parse(char *commandLine)

{
  char cVar1;
  char cVar2;
  deBool dVar3;
  uint uVar4;
  deMemPool *pool;
  dePoolArray *arr;
  size_t sVar5;
  char *ptr;
  deCommandLine *ptr_00;
  char **ppcVar6;
  ulong uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  
  pool = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
  if (pool == (deMemPool *)0x0) {
    return (deCommandLine *)0x0;
  }
  arr = dePoolArray_create(pool,8);
  if (arr != (dePoolArray *)0x0) {
    sVar5 = strlen(commandLine);
    ptr = (char *)deCalloc(sVar5 + 1);
    if (ptr != (char *)0x0) {
      uVar4 = arr->numElements;
      iVar9 = uVar4 + 1;
      if (arr->capacity < iVar9) {
        dVar3 = dePoolArray_reserve(arr,iVar9);
        if (dVar3 == 0) goto LAB_00ad07b3;
        uVar4 = arr->numElements;
        iVar9 = uVar4 + 1;
      }
      arr->numElements = iVar9;
      *(char **)((long)arr->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 8) = ptr;
      cVar8 = *commandLine;
      pcVar12 = ptr;
      if (cVar8 != '\0') {
        iVar9 = 0;
        pcVar11 = ptr;
        cVar1 = '\0';
        do {
          iVar10 = iVar9 + 1;
          cVar2 = cVar1;
          if (cVar8 == '\\' && cVar1 != '\0') {
            iVar9 = iVar9 + 2;
            cVar8 = commandLine[iVar10];
            pcVar12 = pcVar11 + 1;
            if (cVar8 == 't') {
              *pcVar11 = '\t';
            }
            else if (cVar8 == 'n') {
              *pcVar11 = '\n';
            }
            else {
              *pcVar11 = cVar8;
            }
          }
          else {
            pcVar12 = pcVar11;
            iVar9 = iVar10;
            if (cVar8 == cVar1) {
LAB_00ad06a5:
              cVar2 = '\0';
            }
            else {
              if (cVar1 == '\0') {
                cVar2 = cVar8;
                if ((cVar8 == '\'') || (cVar8 == '\"')) goto LAB_00ad06c6;
                if (cVar8 == ' ') {
                  *pcVar11 = '\0';
                  uVar4 = arr->numElements;
                  iVar10 = uVar4 + 1;
                  if (arr->capacity < iVar10) {
                    dVar3 = dePoolArray_reserve(arr,iVar10);
                    if (dVar3 == 0) goto LAB_00ad07ab;
                    uVar4 = arr->numElements;
                    iVar10 = uVar4 + 1;
                  }
                  pcVar12 = pcVar11 + 1;
                  arr->numElements = iVar10;
                  *(char **)((long)arr->pageTable[(int)uVar4 >> 4] + (ulong)(uVar4 & 0xf) * 8) =
                       pcVar12;
                  goto LAB_00ad06a5;
                }
              }
              *pcVar11 = cVar8;
              pcVar12 = pcVar11 + 1;
              cVar2 = cVar1;
            }
          }
LAB_00ad06c6:
          cVar8 = commandLine[iVar9];
          pcVar11 = pcVar12;
          cVar1 = cVar2;
        } while (cVar8 != '\0');
      }
      *pcVar12 = '\0';
      ptr_00 = (deCommandLine *)deCalloc(0x18);
      if (ptr_00 != (deCommandLine *)0x0) {
        ppcVar6 = (char **)deCalloc((long)arr->numElements << 3);
        ptr_00->args = ppcVar6;
        if (ppcVar6 != (char **)0x0) {
          iVar9 = arr->numElements;
          ptr_00->numArgs = iVar9;
          ptr_00->argBuf = ptr;
          if (0 < (long)iVar9) {
            uVar7 = 0;
            do {
              ptr_00->args[uVar7] =
                   *(char **)((long)arr->pageTable[uVar7 >> 4 & 0xfffffff] +
                             (ulong)((uint)uVar7 & 0xf) * 8);
              uVar7 = uVar7 + 1;
            } while ((long)iVar9 != uVar7);
          }
          goto LAB_00ad07b6;
        }
      }
      deFree(ptr_00);
LAB_00ad07ab:
      deFree(ptr);
    }
  }
LAB_00ad07b3:
  ptr_00 = (deCommandLine *)0x0;
LAB_00ad07b6:
  deMemPool_destroy(pool);
  return ptr_00;
}

Assistant:

deCommandLine* deCommandLine_parse (const char* commandLine)
{
	deMemPool*		tmpPool		= deMemPool_createRoot(DE_NULL, 0);
	CharPtrArray*	args		= tmpPool ? CharPtrArray_create(tmpPool) : DE_NULL;
	char*			buf			= DE_NULL;
	char*			outPtr;
	int				pos;
	int				argNdx;
	char			strChr;

	if (!args)
	{
		if (tmpPool)
			deMemPool_destroy(tmpPool);
		return DE_NULL;
	}

	DE_ASSERT(commandLine);

	/* Create buffer for args (no expansion can happen). */
	buf		= (char*)deCalloc(strlen(commandLine)+1);
	pos		= 0;
	argNdx	= 0;
	outPtr	= buf;
	strChr	= 0;

	if (!buf || !CharPtrArray_pushBack(args, buf))
	{
		deMemPool_destroy(tmpPool);
		return DE_NULL;
	}

	while (commandLine[pos] != 0)
	{
		char c = commandLine[pos++];

		if (strChr != 0 && c == '\\')
		{
			/* Escape. */
			c = commandLine[pos++];
			switch (c)
			{
				case 'n':	*outPtr++ = '\n';	break;
				case 't':	*outPtr++ = '\t';	break;
				default:	*outPtr++ = c;		break;
			}
		}
		else if (strChr != 0 && c == strChr)
		{
			/* String end. */
			strChr = 0;
		}
		else if (strChr == 0 && (c == '"' || c == '\''))
		{
			/* String start. */
			strChr = c;
		}
		else if (c == ' ' && strChr == 0)
		{
			/* Arg end. */
			*outPtr++		 = 0;
			argNdx			+= 1;
			if (!CharPtrArray_pushBack(args, outPtr))
			{
				deFree(buf);
				deMemPool_destroy(tmpPool);
				return DE_NULL;
			}
		}
		else
			*outPtr++ = c;
	}

	DE_ASSERT(commandLine[pos] == 0);

	/* Terminate last arg. */
	*outPtr = 0;

	/* Create deCommandLine. */
	{
		deCommandLine* cmdLine = (deCommandLine*)deCalloc(sizeof(deCommandLine));

		if (!cmdLine || !(cmdLine->args = (char**)deCalloc(sizeof(char*)*(size_t)CharPtrArray_getNumElements(args))))
		{
			deFree(cmdLine);
			deFree(buf);
			deMemPool_destroy(tmpPool);
			return DE_NULL;
		}

		cmdLine->numArgs	= CharPtrArray_getNumElements(args);
		cmdLine->argBuf		= buf;

		for (argNdx = 0; argNdx < cmdLine->numArgs; argNdx++)
			cmdLine->args[argNdx] = CharPtrArray_get(args, argNdx);

		deMemPool_destroy(tmpPool);
		return cmdLine;
	}
}